

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

raw_problem_status parse(context *ctx,stream_buffer *buf,problem_parser *p)

{
  double dVar1;
  operator_type oVar2;
  optional<baryonyx::objective_function_type> oVar3;
  bool bVar4;
  type tVar5;
  int size;
  objective_function_type *poVar6;
  element_type *this;
  function_element_token *pfVar7;
  pointer pfVar8;
  iterator __first;
  iterator __last;
  reference pvVar9;
  operator_token *poVar10;
  real_token *prVar11;
  size_type sVar12;
  size_type sVar13;
  size_type sVar14;
  bound_token *pbVar15;
  file_format_error_tag tag_;
  string_view sVar16;
  string_view sVar17;
  raw_problem_status rVar18;
  optional<operator_token> oVar19;
  byte local_689;
  byte local_639;
  string_view local_610;
  string_view local_600;
  string_view local_5f0;
  int local_5dc;
  undefined1 auStack_5d8 [4];
  int read_5;
  string_view local_5c8;
  string_view local_5b8;
  string_view local_5a8;
  int local_594;
  undefined1 auStack_590 [4];
  int read_4;
  string_view local_580;
  string_view local_570;
  string_view local_560;
  int local_54c;
  double dStack_548;
  int read_3;
  double dStack_540;
  size_t sStack_538;
  char *pcStack_530;
  undefined8 local_528;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL> local_518;
  undefined1 local_478 [8];
  optional<bound_token> bound_opt;
  int local_414;
  int read_2;
  int local_40c;
  string_view local_408;
  string_view local_3f8;
  undefined1 local_3e8 [8];
  optional<real_token> value_opt;
  operator_type local_3c8;
  _Storage<operator_token,_true> local_3a0;
  optional<operator_token> operator_opt;
  __normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
  local_370;
  __normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
  it_1;
  anon_class_4_1_3fcf65d9_for__M_pred local_354;
  undefined1 auStack_350 [4];
  int id_1;
  string_view local_340;
  string_view local_330;
  optional<function_element_token> local_320;
  string_view local_2f8;
  string_view local_2e8;
  int local_2d4;
  __normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
  local_2d0;
  int local_2c4;
  function_element *local_2c0;
  __normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
  local_2b8;
  __normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
  local_2b0;
  __normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
  it;
  anon_class_4_1_3fcf65d9_for__M_pred local_298;
  int local_294;
  int id;
  string_view local_280;
  string_view local_270;
  undefined1 local_260 [8];
  optional<function_element_token> elem_1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_218;
  basic_string_view<char,_std::char_traits<char>_> local_208;
  string_view local_1f8;
  undefined1 local_1e8 [8];
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> elements;
  undefined1 auStack_1c8 [4];
  int value;
  string_view label;
  string_view local_1a0;
  int local_18c;
  undefined1 auStack_188 [4];
  int constraint_next_id;
  string_view local_178;
  string_view local_168;
  int local_154;
  undefined1 auStack_150 [4];
  int read_1;
  string_view local_140;
  string_view local_130;
  undefined1 local_120 [8];
  optional<function_element_token> elem;
  file_format_error_tag local_f0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  double local_a8;
  double factor;
  string_view local_90;
  string_view local_80;
  string_view local_70;
  string_view local_60;
  int local_4c;
  undefined1 auStack_48 [4];
  int read;
  _Optional_payload_base<baryonyx::objective_function_type> local_38;
  optional<baryonyx::objective_function_type> obj_type;
  problem_parser *p_local;
  stream_buffer *buf_local;
  context *ctx_local;
  raw_problem_status ret;
  
  obj_type.super__Optional_base<baryonyx::objective_function_type,_true,_true>._M_payload.
  super__Optional_payload_base<baryonyx::objective_function_type> =
       (_Optional_base<baryonyx::objective_function_type,_true,_true>)
       (_Optional_base<baryonyx::objective_function_type,_true,_true>)p;
  _auStack_48 = stream_buffer::first(buf);
  local_38 = (_Optional_payload_base<baryonyx::objective_function_type>)
             read_objective_type(_auStack_48);
  bVar4 = std::optional::operator_cast_to_bool((optional *)&local_38);
  if (bVar4) {
    poVar6 = std::optional<baryonyx::objective_function_type>::operator*
                       ((optional<baryonyx::objective_function_type> *)&local_38);
    *(objective_function_type *)
     ((long)obj_type.super__Optional_base<baryonyx::objective_function_type,_true,_true>._M_payload.
            super__Optional_payload_base<baryonyx::objective_function_type> + 0xc0) = *poVar6;
    stream_buffer::pop_front(buf);
    local_60 = stream_buffer::first(buf);
    local_70 = stream_buffer::second(buf);
    local_4c = try_read_objective_label(local_60,local_70);
    if (local_4c != 0) {
      stream_buffer::pop_front(buf,local_4c);
    }
    do {
      while( true ) {
        local_80 = stream_buffer::first(buf);
        bVar4 = is_keyword(local_80);
        if (((bVar4 ^ 0xffU) & 1) == 0) {
          local_168 = stream_buffer::first(buf);
          local_178 = stream_buffer::second(buf);
          _auStack_188 = stream_buffer::third(buf);
          local_154 = read_subject_to(local_168,local_178,_auStack_188);
          if (local_154 == 0) goto LAB_0015967c;
          stream_buffer::pop_front(buf,local_154);
          local_18c = 0;
          goto LAB_00158c37;
        }
        local_90 = stream_buffer::first(buf);
        _factor = stream_buffer::second(buf);
        bVar4 = starts_with_quadratic(local_90,_factor);
        if (bVar4) break;
        local_130 = stream_buffer::first(buf);
        local_140 = stream_buffer::second(buf);
        _auStack_150 = stream_buffer::third(buf);
        read_function_element
                  ((optional<function_element_token> *)local_120,local_130,local_140,_auStack_150);
        bVar4 = std::optional::operator_cast_to_bool((optional *)local_120);
        oVar3 = obj_type;
        if (!bVar4) {
          raw_problem_status::raw_problem_status
                    ((raw_problem_status *)((long)&ctx_local + 4),bad_objective);
          goto LAB_00159aef;
        }
        pfVar7 = std::optional<function_element_token>::operator*
                           ((optional<function_element_token> *)local_120);
        bVar4 = problem_parser::append_to_objective
                          ((problem_parser *)
                           oVar3.super__Optional_base<baryonyx::objective_function_type,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<baryonyx::objective_function_type>,pfVar7);
        if (!bVar4) {
          raw_problem_status::raw_problem_status
                    ((raw_problem_status *)((long)&ctx_local + 4),too_many_variables);
          goto LAB_00159aef;
        }
        pfVar7 = std::optional<function_element_token>::operator->
                           ((optional<function_element_token> *)local_120);
        stream_buffer::pop_front(buf,pfVar7->read);
      }
      local_a8 = 1.0;
      local_b8 = stream_buffer::first(buf);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,"-");
      bVar4 = std::operator==(local_b8,local_c8);
      if (bVar4) {
        local_a8 = -1.0;
        stream_buffer::pop_front(buf);
      }
      else {
        local_d8 = stream_buffer::first(buf);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8,"+");
        bVar4 = std::operator==(local_d8,local_e8);
        if (bVar4) {
          stream_buffer::pop_front(buf);
        }
      }
      rVar18 = read_quadratic_element
                         (buf,(problem_parser *)
                              obj_type.
                              super__Optional_base<baryonyx::objective_function_type,_true,_true>.
                              _M_payload.
                              super__Optional_payload_base<baryonyx::objective_function_type>,
                          local_a8);
      elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
      super__Optional_payload_base<function_element_token>._32_8_ = rVar18._0_8_;
      ctx_local._4_1_ =
           elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
           super__Optional_payload_base<function_element_token>._M_engaged;
      stack0xffffffffffffffed =
           elem.super__Optional_base<function_element_token,_true,_true>._M_payload.
           super__Optional_payload_base<function_element_token>._33_7_;
      local_f0 = rVar18.column;
      ret.tag = local_f0;
      unique0x100017dd = rVar18;
      bVar4 = raw_problem_status::operator_cast_to_bool
                        ((raw_problem_status *)((long)&ctx_local + 4));
    } while (bVar4);
  }
  else {
    raw_problem_status::raw_problem_status
              ((raw_problem_status *)((long)&ctx_local + 4),bad_objective_function_type);
  }
  goto LAB_00159aef;
LAB_00158c37:
  do {
    local_1a0 = stream_buffer::first(buf);
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_1a0);
    local_639 = 0;
    if (!bVar4) {
      sVar16 = stream_buffer::first(buf);
      bVar4 = is_keyword(sVar16);
      local_639 = bVar4 ^ 0xff;
    }
    if ((local_639 & 1) == 0) {
      sVar12 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::size
                         ((vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                          ((long)obj_type.
                                 super__Optional_base<baryonyx::objective_function_type,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<baryonyx::objective_function_type> +
                          0x48));
      sVar13 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::size
                         ((vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                          ((long)obj_type.
                                 super__Optional_base<baryonyx::objective_function_type,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<baryonyx::objective_function_type> +
                          0x60));
      sVar14 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::size
                         ((vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *)
                          ((long)obj_type.
                                 super__Optional_base<baryonyx::objective_function_type,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<baryonyx::objective_function_type> +
                          0x78));
      tVar5 = baryonyx::to_unsigned<int>(0x7fffffff);
      if (sVar12 + sVar13 + sVar14 <= (ulong)tVar5) goto LAB_0015967c;
      raw_problem_status::raw_problem_status
                ((raw_problem_status *)((long)&ctx_local + 4),too_many_constraints);
      break;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_1c8);
    std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::vector
              ((vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *)
               local_1e8);
    local_1f8 = stream_buffer::first(buf);
    bVar4 = starts_with_name(local_1f8);
    if (bVar4) {
      local_208 = stream_buffer::second(buf);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_218,":");
      bVar4 = std::operator==(local_208,local_218);
      if (bVar4) {
        this = std::
               __shared_ptr_access<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)obj_type.
                               super__Optional_base<baryonyx::objective_function_type,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<baryonyx::objective_function_type>);
        join_0x00000010_0x00000000_ = stream_buffer::first(buf);
        sVar16 = baryonyx::string_buffer::append(this,join_0x00000010_0x00000000_);
        label._M_len = (size_t)sVar16._M_str;
        _auStack_1c8 = sVar16._M_len;
        stream_buffer::pop_front(buf,2);
      }
    }
    local_270 = stream_buffer::first(buf);
    local_280 = stream_buffer::second(buf);
    _id = stream_buffer::third(buf);
    read_function_element((optional<function_element_token> *)local_260,local_270,local_280,_id);
    bVar4 = std::optional::operator_cast_to_bool((optional *)local_260);
    oVar3 = obj_type;
    if (bVar4) {
      pfVar7 = std::optional<function_element_token>::operator->
                         ((optional<function_element_token> *)local_260);
      it._M_current = (function_element *)(pfVar7->name)._M_len;
      local_298.id = problem_parser::get_or_assign_variable
                               ((problem_parser *)
                                oVar3.
                                super__Optional_base<baryonyx::objective_function_type,_true,_true>.
                                _M_payload.
                                super__Optional_payload_base<baryonyx::objective_function_type>,
                                pfVar7->name);
      if (local_298.id == -1) {
        raw_problem_status::raw_problem_status
                  ((raw_problem_status *)((long)&ctx_local + 4),too_many_variables);
        local_294 = 1;
      }
      else {
        local_2b8._M_current =
             (function_element *)
             std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
             begin((vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    *)local_1e8);
        local_2c0 = (function_element *)
                    std::
                    vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    ::end((vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                           *)local_1e8);
        local_2c4 = local_298.id;
        local_2b0 = std::
                    find_if<__gnu_cxx::__normal_iterator<baryonyx::function_element*,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,parse(baryonyx::context_const&,stream_buffer&,problem_parser&)::__0>
                              (local_2b8,
                               (__normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                                )local_2c0,local_298);
        local_2d0._M_current =
             (function_element *)
             std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
             end((vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *)
                 local_1e8);
        bVar4 = __gnu_cxx::
                operator==<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                          (&local_2b0,&local_2d0);
        if (bVar4) {
          pfVar7 = std::optional<function_element_token>::operator->
                             ((optional<function_element_token> *)local_260);
          local_2d4 = (int)pfVar7->factor;
          std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>::
          emplace_back<int,int&>
                    ((vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>
                      *)local_1e8,&local_2d4,&local_298.id);
        }
        else {
          pfVar7 = std::optional<function_element_token>::operator->
                             ((optional<function_element_token> *)local_260);
          dVar1 = pfVar7->factor;
          pfVar8 = __gnu_cxx::
                   __normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                   ::operator->(&local_2b0);
          pfVar8->factor = (int)dVar1 + pfVar8->factor;
        }
        pfVar7 = std::optional<function_element_token>::operator->
                           ((optional<function_element_token> *)local_260);
        stream_buffer::pop_front(buf,pfVar7->read);
        while( true ) {
          local_2e8 = stream_buffer::first(buf);
          bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_2e8);
          local_689 = 0;
          if (!bVar4) {
            local_2f8 = stream_buffer::first(buf);
            bVar4 = starts_with_operator(local_2f8);
            local_689 = bVar4 ^ 0xff;
          }
          if ((local_689 & 1) == 0) {
            sVar16 = stream_buffer::first(buf);
            sVar17 = stream_buffer::second(buf);
            oVar19 = read_operator(sVar16,sVar17);
            value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
            super__Optional_payload_base<real_token>._16_8_ =
                 oVar19.super__Optional_base<operator_token,_true,_true>._M_payload.
                 super__Optional_payload_base<operator_token>._M_payload;
            local_3c8 = CONCAT31(local_3c8._1_3_,
                                 oVar19.super__Optional_base<operator_token,_true,_true>._M_payload.
                                 super__Optional_payload_base<operator_token>._M_engaged);
            operator_opt.super__Optional_base<operator_token,_true,_true>._M_payload.
            super__Optional_payload_base<operator_token>._M_payload._M_value.op = local_3c8;
            local_3a0 = (_Storage<operator_token,_true>)
                        value_opt.super__Optional_base<real_token,_true,_true>._M_payload.
                        super__Optional_payload_base<real_token>._16_8_;
            bVar4 = std::optional::operator_cast_to_bool((optional *)&local_3a0._M_value);
            if (bVar4) {
              poVar10 = std::optional<operator_token>::operator->
                                  ((optional<operator_token> *)&local_3a0._M_value);
              stream_buffer::pop_front(buf,poVar10->read);
              local_3f8 = stream_buffer::first(buf);
              local_408 = stream_buffer::second(buf);
              read_real((optional<real_token> *)local_3e8,local_3f8,local_408);
              bVar4 = std::optional::operator_cast_to_bool((optional *)local_3e8);
              if (bVar4) {
                prVar11 = std::optional<real_token>::operator->((optional<real_token> *)local_3e8);
                elements.
                super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)prVar11->value;
                prVar11 = std::optional<real_token>::operator->((optional<real_token> *)local_3e8);
                stream_buffer::pop_front(buf,prVar11->read);
                poVar10 = std::optional<operator_token>::operator->
                                    ((optional<operator_token> *)&local_3a0._M_value);
                oVar2 = poVar10->op;
                if (oVar2 == equal) {
                  local_40c = local_18c;
                  local_18c = local_18c + 1;
                  std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>::
                  emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,int&,int>
                            ((vector<baryonyx::constraint,std::allocator<baryonyx::constraint>> *)
                             ((long)obj_type.
                                    super__Optional_base<baryonyx::objective_function_type,_true,_true>
                                    ._M_payload.
                                    super__Optional_payload_base<baryonyx::objective_function_type>
                             + 0x48),(basic_string_view<char,_std::char_traits<char>_> *)auStack_1c8
                             ,(vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                               *)local_1e8,
                             (int *)((long)&elements.
                                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                             &local_40c);
                }
                else if (oVar2 == greater) {
                  read_2 = local_18c;
                  local_18c = local_18c + 1;
                  std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>::
                  emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,int&,int>
                            ((vector<baryonyx::constraint,std::allocator<baryonyx::constraint>> *)
                             ((long)obj_type.
                                    super__Optional_base<baryonyx::objective_function_type,_true,_true>
                                    ._M_payload.
                                    super__Optional_payload_base<baryonyx::objective_function_type>
                             + 0x60),(basic_string_view<char,_std::char_traits<char>_> *)auStack_1c8
                             ,(vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                               *)local_1e8,
                             (int *)((long)&elements.
                                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                             &read_2);
                }
                else if (oVar2 == less) {
                  local_414 = local_18c;
                  local_18c = local_18c + 1;
                  std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>::
                  emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,int&,int>
                            ((vector<baryonyx::constraint,std::allocator<baryonyx::constraint>> *)
                             ((long)obj_type.
                                    super__Optional_base<baryonyx::objective_function_type,_true,_true>
                                    ._M_payload.
                                    super__Optional_payload_base<baryonyx::objective_function_type>
                             + 0x78),(basic_string_view<char,_std::char_traits<char>_> *)auStack_1c8
                             ,(vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                               *)local_1e8,
                             (int *)((long)&elements.
                                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                             &local_414);
                }
                local_294 = 0;
              }
              else {
                raw_problem_status::raw_problem_status
                          ((raw_problem_status *)((long)&ctx_local + 4),bad_constraint);
                local_294 = 1;
              }
            }
            else {
              raw_problem_status::raw_problem_status
                        ((raw_problem_status *)((long)&ctx_local + 4),bad_constraint);
              local_294 = 1;
            }
            goto LAB_001595c9;
          }
          local_330 = stream_buffer::first(buf);
          local_340 = stream_buffer::second(buf);
          _auStack_350 = stream_buffer::third(buf);
          read_function_element(&local_320,local_330,local_340,_auStack_350);
          memcpy(local_260,&local_320,0x28);
          bVar4 = std::optional::operator_cast_to_bool((optional *)local_260);
          oVar3 = obj_type;
          if (!bVar4) {
            raw_problem_status::raw_problem_status
                      ((raw_problem_status *)((long)&ctx_local + 4),bad_constraint);
            local_294 = 1;
            goto LAB_001595c9;
          }
          pfVar7 = std::optional<function_element_token>::operator->
                             ((optional<function_element_token> *)local_260);
          it_1._M_current = (function_element *)(pfVar7->name)._M_len;
          local_354.id = problem_parser::get_or_assign_variable
                                   ((problem_parser *)
                                    oVar3.
                                    super__Optional_base<baryonyx::objective_function_type,_true,_true>
                                    ._M_payload.
                                    super__Optional_payload_base<baryonyx::objective_function_type>,
                                    pfVar7->name);
          if (local_354.id == -1) {
            raw_problem_status::raw_problem_status
                      ((raw_problem_status *)((long)&ctx_local + 4),too_many_variables);
            local_294 = 1;
            goto LAB_001595c9;
          }
          __first = std::
                    vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    ::begin((vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                             *)local_1e8);
          __last = std::
                   vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
                   end((vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        *)local_1e8);
          local_370 = std::
                      find_if<__gnu_cxx::__normal_iterator<baryonyx::function_element*,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,parse(baryonyx::context_const&,stream_buffer&,problem_parser&)::__1>
                                (__first._M_current,__last._M_current,local_354);
          register0x00000000 =
               std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
               ::end((vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      *)local_1e8);
          bVar4 = __gnu_cxx::
                  operator==<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                            (&local_370,
                             (__normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                              *)&operator_opt.super__Optional_base<operator_token,_true,_true>.
                                 _M_payload.super__Optional_payload_base<operator_token>._M_engaged)
          ;
          if (bVar4) {
            pfVar7 = std::optional<function_element_token>::operator->
                               ((optional<function_element_token> *)local_260);
            operator_opt.super__Optional_base<operator_token,_true,_true>._M_payload.
            super__Optional_payload_base<operator_token>._M_payload._M_value.read =
                 (int)pfVar7->factor;
            std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>::
            emplace_back<int,int&>
                      ((vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>
                        *)local_1e8,
                       &operator_opt.super__Optional_base<operator_token,_true,_true>._M_payload.
                        super__Optional_payload_base<operator_token>._M_payload._M_value.read,
                       &local_354.id);
          }
          else {
            pfVar7 = std::optional<function_element_token>::operator->
                               ((optional<function_element_token> *)local_260);
            dVar1 = pfVar7->factor;
            pfVar8 = __gnu_cxx::
                     __normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                     ::operator->(&local_370);
            pfVar8->factor = (int)dVar1 + pfVar8->factor;
          }
          pvVar9 = std::
                   vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
                   back((vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         *)local_1e8);
          if (pvVar9->variable_index == -1) break;
          pfVar7 = std::optional<function_element_token>::operator->
                             ((optional<function_element_token> *)local_260);
          stream_buffer::pop_front(buf,pfVar7->read);
        }
        raw_problem_status::raw_problem_status
                  ((raw_problem_status *)((long)&ctx_local + 4),too_many_variables);
        local_294 = 1;
      }
    }
    else {
      raw_problem_status::raw_problem_status
                ((raw_problem_status *)((long)&ctx_local + 4),bad_constraint);
      local_294 = 1;
    }
LAB_001595c9:
    std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::~vector
              ((vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *)
               local_1e8);
  } while (local_294 == 0);
  goto LAB_00159aef;
LAB_0015967c:
  sVar16 = stream_buffer::first(buf);
  sVar17 = stream_buffer::second(buf);
  size = read_bounds(sVar16,sVar17);
  if (size != 0) {
    stream_buffer::pop_front(buf,size);
    while( true ) {
      join_0x00000010_0x00000000_ = stream_buffer::first(buf);
      bVar4 = is_keyword(join_0x00000010_0x00000000_);
      if (((bVar4 ^ 0xffU) & 1) == 0) break;
      stream_buffer::array(&local_518,buf);
      read_bound((optional<bound_token> *)local_478,&local_518);
      bVar4 = std::optional::operator_cast_to_bool((optional *)local_478);
      oVar3 = obj_type;
      if (!bVar4) {
        raw_problem_status::raw_problem_status
                  ((raw_problem_status *)((long)&ctx_local + 4),bad_bound);
        goto LAB_00159aef;
      }
      pbVar15 = std::optional<bound_token>::operator*((optional<bound_token> *)local_478);
      local_528 = *(undefined8 *)&pbVar15->read;
      dStack_548 = pbVar15->min;
      dStack_540 = pbVar15->max;
      sStack_538 = (pbVar15->name)._M_len;
      pcStack_530 = (pbVar15->name)._M_str;
      bVar4 = problem_parser::set_bound_variable
                        ((problem_parser *)
                         oVar3.super__Optional_base<baryonyx::objective_function_type,_true,_true>.
                         _M_payload.super__Optional_payload_base<baryonyx::objective_function_type>,
                         *pbVar15);
      if (!bVar4) {
        raw_problem_status::raw_problem_status
                  ((raw_problem_status *)((long)&ctx_local + 4),bad_bound);
        goto LAB_00159aef;
      }
      pbVar15 = std::optional<bound_token>::operator->((optional<bound_token> *)local_478);
      stream_buffer::pop_front(buf,pbVar15->read);
    }
  }
  local_560 = stream_buffer::first(buf);
  local_570 = stream_buffer::second(buf);
  local_54c = read_binary(local_560,local_570);
  if (local_54c != 0) {
    stream_buffer::pop_front(buf,local_54c);
    while( true ) {
      local_580 = stream_buffer::first(buf);
      bVar4 = is_keyword(local_580);
      oVar3 = obj_type;
      if (((bVar4 ^ 0xffU) & 1) == 0) break;
      _auStack_590 = stream_buffer::first(buf);
      bVar4 = problem_parser::set_boolean_variable
                        ((problem_parser *)
                         oVar3.super__Optional_base<baryonyx::objective_function_type,_true,_true>.
                         _M_payload.super__Optional_payload_base<baryonyx::objective_function_type>,
                         _auStack_590);
      if (!bVar4) {
        raw_problem_status::raw_problem_status
                  ((raw_problem_status *)((long)&ctx_local + 4),bad_binary);
        goto LAB_00159aef;
      }
      stream_buffer::pop_front(buf);
    }
  }
  local_5a8 = stream_buffer::first(buf);
  local_5b8 = stream_buffer::second(buf);
  local_594 = read_general(local_5a8,local_5b8);
  if (local_594 != 0) {
    stream_buffer::pop_front(buf,local_594);
    while( true ) {
      local_5c8 = stream_buffer::first(buf);
      bVar4 = is_keyword(local_5c8);
      oVar3 = obj_type;
      if (((bVar4 ^ 0xffU) & 1) == 0) break;
      _auStack_5d8 = stream_buffer::first(buf);
      bVar4 = problem_parser::set_integer_variable
                        ((problem_parser *)
                         oVar3.super__Optional_base<baryonyx::objective_function_type,_true,_true>.
                         _M_payload.super__Optional_payload_base<baryonyx::objective_function_type>,
                         _auStack_5d8);
      if (!bVar4) {
        raw_problem_status::raw_problem_status
                  ((raw_problem_status *)((long)&ctx_local + 4),bad_general);
        goto LAB_00159aef;
      }
      stream_buffer::pop_front(buf);
    }
  }
  local_5f0 = stream_buffer::first(buf);
  local_600 = stream_buffer::second(buf);
  local_5dc = read_end(local_5f0,local_600);
  if (local_5dc == 0) {
    raw_problem_status::raw_problem_status((raw_problem_status *)((long)&ctx_local + 4),bad_end);
  }
  else {
    stream_buffer::pop_front(buf,local_5dc);
    local_610 = stream_buffer::first(buf);
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_610);
    tag_ = bad_end_of_file;
    if (bVar4) {
      tag_ = success;
    }
    raw_problem_status::raw_problem_status((raw_problem_status *)((long)&ctx_local + 4),tag_);
  }
LAB_00159aef:
  rVar18.column = ret.tag;
  rVar18._0_8_ = stack0xffffffffffffffec;
  return rVar18;
}

Assistant:

raw_problem_status
parse([[maybe_unused]] const baryonyx::context& ctx,
      stream_buffer& buf,
      problem_parser& p) noexcept
{
    if (auto obj_type = read_objective_type(buf.first()); !obj_type)
        return baryonyx::file_format_error_tag::bad_objective_function_type;
    else
        p.m_problem.type = *obj_type;

    buf.pop_front();

    if (auto read = try_read_objective_label(buf.first(), buf.second()); read)
        buf.pop_front(read);

    while (!is_keyword(buf.first())) {
        if (starts_with_quadratic(buf.first(), buf.second())) {
            double factor = 1.0;

            if (buf.first() == "-") {
                factor = -1.0;
                buf.pop_front();
            } else if (buf.first() == "+") {
                buf.pop_front();
            }

            if (auto ret = read_quadratic_element(buf, p, factor); !ret)
                return ret;
            continue;
        }

        if (auto elem =
              read_function_element(buf.first(), buf.second(), buf.third());
            elem) {
            if (!p.append_to_objective(*elem))
                return baryonyx::file_format_error_tag::too_many_variables;

            buf.pop_front(elem->read);
            continue;
        }

        return baryonyx::file_format_error_tag::bad_objective;
    }

    if (auto read = read_subject_to(buf.first(), buf.second(), buf.third());
        read) {
        buf.pop_front(read);
        int constraint_next_id = 0;

        while (!buf.first().empty() && !is_keyword(buf.first())) {
            std::string_view label;
            int value;
            std::vector<baryonyx::function_element> elements;

            if (starts_with_name(buf.first()) && buf.second() == ":") {
                label = p.m_problem.strings->append(buf.first());
                buf.pop_front(2);
            }

            auto elem =
              read_function_element(buf.first(), buf.second(), buf.third());
            if (!elem)
                return baryonyx::file_format_error_tag::bad_constraint;

            {
                auto id = p.get_or_assign_variable(elem->name);
                if (id == -1)
                    return baryonyx::file_format_error_tag::too_many_variables;

                auto it = std::find_if(
                  elements.begin(), elements.end(), [id](const auto& elem) {
                      return elem.variable_index == id;
                  });

                if (it == elements.end())
                    elements.emplace_back(static_cast<int>(elem->factor), id);
                else
                    it->factor += static_cast<int>(elem->factor);
            }

            buf.pop_front(elem->read);

            while (!buf.first().empty() &&
                   !starts_with_operator(buf.first())) {
                elem = read_function_element(
                  buf.first(), buf.second(), buf.third());
                if (!elem)
                    return baryonyx::file_format_error_tag::bad_constraint;

                {
                    auto id = p.get_or_assign_variable(elem->name);
                    if (id == -1)
                        return baryonyx::file_format_error_tag::
                          too_many_variables;

                    auto it =
                      std::find_if(elements.begin(),
                                   elements.end(),
                                   [id](const auto& elem) {
                                       return elem.variable_index == id;
                                   });

                    if (it == elements.end())
                        elements.emplace_back(static_cast<int>(elem->factor),
                                              id);
                    else
                        it->factor += static_cast<int>(elem->factor);
                }

                if (elements.back().variable_index == -1)
                    return baryonyx::file_format_error_tag::too_many_variables;

                buf.pop_front(elem->read);
            }

            auto operator_opt = read_operator(buf.first(), buf.second());
            if (!operator_opt)
                return baryonyx::file_format_error_tag::bad_constraint;
            buf.pop_front(operator_opt->read);

            auto value_opt = read_real(buf.first(), buf.second());
            if (!value_opt)
                return baryonyx::file_format_error_tag::bad_constraint;
            value = static_cast<int>(value_opt->value);
            buf.pop_front(value_opt->read);

            switch (operator_opt->op) {
            case baryonyx::operator_type::equal:
                p.m_problem.equal_constraints.emplace_back(
                  label, std::move(elements), value, constraint_next_id++);
                break;
            case baryonyx::operator_type::greater:
                p.m_problem.greater_constraints.emplace_back(
                  label, std::move(elements), value, constraint_next_id++);
                break;
            case baryonyx::operator_type::less:
                p.m_problem.less_constraints.emplace_back(
                  label, std::move(elements), value, constraint_next_id++);
                break;
            }
        }

        if (p.m_problem.equal_constraints.size() +
              p.m_problem.greater_constraints.size() +
              p.m_problem.less_constraints.size() >
            baryonyx::to_unsigned(INT_MAX))
            return baryonyx::file_format_error_tag::too_many_constraints;
    }

    if (auto read = read_bounds(buf.first(), buf.second()); read) {
        buf.pop_front(read);

        while (!is_keyword(buf.first())) {
            auto bound_opt = read_bound(buf.array());
            if (!bound_opt)
                return baryonyx::file_format_error_tag::bad_bound;

            if (!p.set_bound_variable(*bound_opt))
                return baryonyx::file_format_error_tag::bad_bound;

            buf.pop_front(bound_opt->read);
        }
    }

    if (auto read = read_binary(buf.first(), buf.second()); read) {
        buf.pop_front(read);

        while (!is_keyword(buf.first()))
            if (!p.set_boolean_variable(buf.first()))
                return baryonyx::file_format_error_tag::bad_binary;
            else
                buf.pop_front();
    }

    if (auto read = read_general(buf.first(), buf.second()); read) {
        buf.pop_front(read);

        while (!is_keyword(buf.first()))
            if (!p.set_integer_variable(buf.first()))
                return baryonyx::file_format_error_tag::bad_general;
            else
                buf.pop_front();
    }

    if (auto read = read_end(buf.first(), buf.second()); read) {
        buf.pop_front(read);

        return buf.first().empty()
                 ? baryonyx::file_format_error_tag::success
                 : baryonyx::file_format_error_tag::bad_end_of_file;
    }

    return baryonyx::file_format_error_tag::bad_end;
}